

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_vector(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab_00;
  uint64_t lab_01;
  operand local_2dc;
  operation local_2d8;
  operand local_2d4 [2];
  operation local_2cc [2];
  operand local_2c4 [2];
  operation local_2bc [2];
  operand local_2b4 [2];
  operation local_2ac;
  operand local_2a8;
  operation local_2a4 [4];
  operand local_294;
  operation local_290 [2];
  operand local_288 [2];
  operation local_280 [2];
  operand local_278 [2];
  operation local_270;
  operand local_26c [2];
  operation local_264;
  operand local_260 [2];
  operation local_258 [2];
  undefined1 local_250 [8];
  string lab;
  operand local_228;
  operation local_224 [2];
  operand local_21c [2];
  operation local_214 [2];
  operand local_20c [2];
  operation local_204 [3];
  operand local_1f8 [2];
  operation local_1f0;
  operand local_1ec [3];
  operation local_1e0 [3];
  operand local_1d4 [2];
  operation local_1cc;
  operand local_1c8 [3];
  operation local_1bc [3];
  operand local_1b0 [2];
  operation local_1a8;
  operand local_1a4 [3];
  operation local_198 [3];
  operand local_18c [2];
  operation local_184;
  operand local_180 [3];
  operation local_174 [3];
  operand local_168 [2];
  operation local_160;
  operand local_15c [3];
  operation local_150 [3];
  operand local_144 [2];
  operation local_13c;
  operand local_138 [3];
  operation local_12c [3];
  operand local_120 [2];
  operation local_118;
  operand local_114 [3];
  operation local_108 [3];
  operand local_fc [2];
  operation local_f4;
  operand local_f0 [3];
  operation local_e4 [3];
  operand local_d8 [2];
  operation local_d0;
  operand local_cc [2];
  operation local_c4 [2];
  operand local_bc [2];
  operation local_b4;
  operand local_b0 [2];
  operation local_a8;
  operand local_a4 [2];
  operation local_9c;
  unsigned_long local_98;
  operand local_90 [2];
  operation local_88;
  operand local_84 [2];
  operation local_7c;
  operand local_78;
  operation local_74;
  operand local_70 [2];
  operation local_68 [4];
  undefined1 local_58 [8];
  string done2;
  string done;
  compiler_options *ops_local;
  asmcode *code_local;
  
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done2.field_2 + 8),psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab_00);
  if ((ops->safe_primitives & 1U) != 0) {
    local_68[0] = MOV;
    local_70[1] = 9;
    local_70[0] = R11;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
              (code,local_68,local_70 + 1,local_70);
    local_74 = INC;
    local_78 = RAX;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_74,&local_78);
    check_heap(code,re_vector_heap_overflow);
  }
  local_7c = MOV;
  local_84[1] = 9;
  local_84[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_7c,local_84 + 1,local_84);
  local_88 = MOV;
  local_90[1] = 0x18;
  local_90[0] = NUMBER;
  local_98 = 0x600000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_88,local_90 + 1,local_90,&local_98);
  local_9c = OR;
  local_a4[1] = 9;
  local_a4[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_9c,local_a4 + 1,local_a4);
  local_a8 = MOV;
  local_b0[1] = 0x18;
  local_b0[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_a8,local_b0 + 1,local_b0);
  local_b4 = OR;
  local_bc[1] = 0x18;
  local_bc[0] = NUMBER;
  local_c4[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_b4,local_bc + 1,local_bc,(int *)(local_c4 + 1));
  local_c4[0] = MOV;
  local_cc[1] = 0x20;
  local_cc[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_c4,local_cc + 1,local_cc);
  local_d0 = CMP;
  local_d8[1] = 0x14;
  local_d8[0] = NUMBER;
  local_e4[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_d0,local_d8 + 1,local_d8,(int *)(local_e4 + 2));
  local_e4[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_e4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_e4[0] = MOV;
  local_f0[2] = 0x20;
  local_f0[1] = 8;
  local_f0[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_e4,local_f0 + 2,(int *)(local_f0 + 1),local_f0);
  local_f4 = CMP;
  local_fc[1] = 0x14;
  local_fc[0] = NUMBER;
  local_108[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_f4,local_fc + 1,local_fc,(int *)(local_108 + 2));
  local_108[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_108 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_108[0] = MOV;
  local_114[2] = 0x20;
  local_114[1] = 0x10;
  local_114[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_108,local_114 + 2,(int *)(local_114 + 1),local_114);
  local_118 = CMP;
  local_120[1] = 0x14;
  local_120[0] = NUMBER;
  local_12c[2] = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_118,local_120 + 1,local_120,(int *)(local_12c + 2));
  local_12c[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_12c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_12c[0] = MOV;
  local_138[2] = 0x20;
  local_138[1] = 0x18;
  local_138[0] = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_12c,local_138 + 2,(int *)(local_138 + 1),local_138);
  local_13c = CMP;
  local_144[1] = 0x14;
  local_144[0] = NUMBER;
  local_150[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_13c,local_144 + 1,local_144,(int *)(local_150 + 2));
  local_150[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_150 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_150[0] = MOV;
  local_15c[2] = 0x20;
  local_15c[1] = 0x20;
  local_15c[0] = RDI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_150,local_15c + 2,(int *)(local_15c + 1),local_15c);
  local_160 = CMP;
  local_168[1] = 0x14;
  local_168[0] = NUMBER;
  local_174[2] = 4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_160,local_168 + 1,local_168,(int *)(local_174 + 2));
  local_174[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_174 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_174[0] = MOV;
  local_180[2] = 0x20;
  local_180[1] = 0x28;
  local_180[0] = R8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_174,local_180 + 2,(int *)(local_180 + 1),local_180);
  local_184 = CMP;
  local_18c[1] = 0x14;
  local_18c[0] = NUMBER;
  local_198[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_184,local_18c + 1,local_18c,(int *)(local_198 + 2));
  local_198[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_198 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_198[0] = MOV;
  local_1a4[2] = 0x20;
  local_1a4[1] = 0x30;
  local_1a4[0] = R9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_198,local_1a4 + 2,(int *)(local_1a4 + 1),local_1a4);
  local_1a8 = CMP;
  local_1b0[1] = 0x14;
  local_1b0[0] = NUMBER;
  local_1bc[2] = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1a8,local_1b0 + 1,local_1b0,(int *)(local_1bc + 2));
  local_1bc[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1bc + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_1bc[0] = MOV;
  local_1c8[2] = 0x20;
  local_1c8[1] = 0x38;
  local_1c8[0] = R12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_1bc,local_1c8 + 2,(int *)(local_1c8 + 1),local_1c8);
  local_1cc = CMP;
  local_1d4[1] = 0x14;
  local_1d4[0] = NUMBER;
  local_1e0[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1cc,local_1d4 + 1,local_1d4,(int *)(local_1e0 + 2));
  local_1e0[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1e0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_1e0[0] = MOV;
  local_1ec[2] = 0x20;
  local_1ec[1] = 0x40;
  local_1ec[0] = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,local_1e0,local_1ec + 2,(int *)(local_1ec + 1),local_1ec);
  local_1f0 = CMP;
  local_1f8[1] = 0x14;
  local_1f8[0] = NUMBER;
  local_204[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1f0,local_1f8 + 1,local_1f8,(int *)(local_204 + 2));
  local_204[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_204 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_204[0] = SUB;
  local_20c[1] = 0x14;
  local_20c[0] = NUMBER;
  local_214[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_204,local_20c + 1,local_20c,(int *)(local_214 + 1));
  local_214[0] = ADD;
  local_21c[1] = 0x10;
  local_21c[0] = NUMBER;
  local_224[1] = 0x48;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_214,local_21c + 1,local_21c,(int *)(local_224 + 1));
  local_224[0] = MOV;
  local_228 = RDX;
  lab.field_2._12_4_ = 0x23;
  lab.field_2._8_4_ = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_224,&stack0xfffffffffffffdd8,(operand *)(lab.field_2._M_local_buf + 0xc),
             (int *)(lab.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_250,psVar1,lab_01);
  local_258[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_258 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  local_258[0] = MOV;
  local_260[1] = 0xb;
  local_260[0] = MEM_RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_258,local_260 + 1,local_260);
  local_264 = MOV;
  local_26c[1] = 0x20;
  local_26c[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_264,local_26c + 1,local_26c);
  local_270 = ADD;
  local_278[1] = 0x10;
  local_278[0] = NUMBER;
  local_280[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_270,local_278 + 1,local_278,(int *)(local_280 + 1));
  local_280[0] = ADD;
  local_288[1] = 0xc;
  local_288[0] = NUMBER;
  local_290[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_280,local_288 + 1,local_288,(int *)(local_290 + 1));
  local_290[0] = DEC;
  local_294 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_290,&local_294);
  local_2a4[3] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2a4 + 3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_2a4[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2a4 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250);
  local_2a4[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2a4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done2.field_2 + 8));
  local_2a4[0] = INC;
  local_2a8 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_2a4,&local_2a8);
  local_2ac = SHL;
  local_2b4[1] = 0x14;
  local_2b4[0] = NUMBER;
  local_2bc[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_2ac,local_2b4 + 1,local_2b4,(int *)(local_2bc + 1));
  local_2bc[0] = ADD;
  local_2c4[1] = 0x10;
  local_2c4[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_2bc,local_2c4 + 1,local_2c4);
  local_2cc[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2cc + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  local_2cc[0] = MOV;
  local_2d4[1] = 9;
  local_2d4[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_2cc,local_2d4 + 1,local_2d4);
  local_2d8 = JMP;
  local_2dc = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2d8,&local_2dc);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(done2.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_vector(asmcode& code, const compiler_options& ops)
  {
  auto done = label_to_string(label++);
  auto done2 = label_to_string(label++);
  if (ops.safe_primitives)
    {
    code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
    code.add(asmcode::INC, asmcode::RAX);
    check_heap(code, re_vector_heap_overflow);
    }
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)vector_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, done); // assembly can jump short, but vm cannot
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RCX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(2), asmcode::RDX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(3), asmcode::RSI);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(4), asmcode::RDI);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(5), asmcode::R8);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(6), asmcode::R9);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(7), asmcode::R12);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::JES, done);
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(8), asmcode::R14);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::JES, done);

  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(9));
  code.add(asmcode::MOV, asmcode::RDX, LOCAL);

  auto lab = label_to_string(label++);
  code.add(asmcode::LABEL, lab);

  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RDX);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RCX);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::ADD, asmcode::RDX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::JE, done2);
  code.add(asmcode::JMPS, lab);

  code.add(asmcode::LABEL, done);
  code.add(asmcode::INC, asmcode::R11);
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, ALLOC, asmcode::R11);
  code.add(asmcode::LABEL, done2);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R15);
  code.add(asmcode::JMP, CONTINUE);
  }